

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O2

cTValue * lj_debug_frame(lua_State *L,int level,int *size)

{
  uint uVar1;
  cTValue *pcVar2;
  int iVar3;
  cTValue *pcVar4;
  
  pcVar4 = L->base + -1;
  pcVar2 = L->base + -1;
  do {
    if (pcVar2 <= (cTValue *)(ulong)(L->stack).ptr32) {
      pcVar2 = (cTValue *)0x0;
LAB_00108806:
      *size = level;
      return pcVar2;
    }
    iVar3 = level + (uint)((lua_State *)(ulong)(pcVar2->u32).lo == L);
    level = iVar3 + -1;
    if (iVar3 == 0) {
      level = (int)((ulong)((long)pcVar4 - (long)pcVar2) >> 3);
      goto LAB_00108806;
    }
    uVar1 = (pcVar2->field_2).it;
    pcVar4 = pcVar2;
    if ((uVar1 & 3) == 0) {
      pcVar2 = pcVar2 + (-1 - (ulong)*(byte *)((ulong)uVar1 - 3));
    }
    else {
      if ((uVar1 & 7) != 3) {
        iVar3 = level;
      }
      level = iVar3;
      pcVar2 = (cTValue *)((long)pcVar2 - (long)(int)(uVar1 & 0xfffffff8));
    }
  } while( true );
}

Assistant:

cTValue *lj_debug_frame(lua_State *L, int level, int *size)
{
  cTValue *frame, *nextframe, *bot = tvref(L->stack);
  /* Traverse frames backwards. */
  for (nextframe = frame = L->base-1; frame > bot; ) {
    if (frame_gc(frame) == obj2gco(L))
      level++;  /* Skip dummy frames. See lj_meta_call(). */
    if (level-- == 0) {
      *size = (int)(nextframe - frame);
      return frame;  /* Level found. */
    }
    nextframe = frame;
    if (frame_islua(frame)) {
      frame = frame_prevl(frame);
    } else {
      if (frame_isvarg(frame))
	level++;  /* Skip vararg pseudo-frame. */
      frame = frame_prevd(frame);
    }
  }
  *size = level;
  return NULL;  /* Level not found. */
}